

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast.h
# Opt level: O0

NodeIt __thiscall trieste::NodeDef::erase(NodeDef *this,NodeIt first,NodeIt last)

{
  bool bVar1;
  __shared_ptr_access<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2,_false,_false> *p_Var2;
  element_type *peVar3;
  iterator iVar4;
  const_iterator local_40;
  const_iterator local_38;
  __normal_iterator<std::shared_ptr<trieste::NodeDef>_*,_std::vector<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>_>
  local_30;
  NodeIt it;
  NodeDef *this_local;
  NodeIt last_local;
  NodeIt first_local;
  
  local_30._M_current = first._M_current;
  it._M_current = (shared_ptr<trieste::NodeDef> *)this;
  this_local = (NodeDef *)last._M_current;
  last_local._M_current = first._M_current;
  while( true ) {
    bVar1 = __gnu_cxx::
            operator==<std::shared_ptr<trieste::NodeDef>_*,_std::vector<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>_>
                      (&local_30,
                       (__normal_iterator<std::shared_ptr<trieste::NodeDef>_*,_std::vector<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>_>
                        *)&this_local);
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    p_Var2 = (__shared_ptr_access<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             __gnu_cxx::
             __normal_iterator<std::shared_ptr<trieste::NodeDef>_*,_std::vector<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>_>
             ::operator*(&local_30);
    peVar3 = std::__shared_ptr_access<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->(p_Var2);
    if (peVar3->parent_ == this) {
      p_Var2 = (__shared_ptr_access<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               __gnu_cxx::
               __normal_iterator<std::shared_ptr<trieste::NodeDef>_*,_std::vector<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>_>
               ::operator*(&local_30);
      peVar3 = std::__shared_ptr_access<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->(p_Var2);
      peVar3->parent_ = (NodeDef *)0x0;
    }
    __gnu_cxx::
    __normal_iterator<std::shared_ptr<trieste::NodeDef>_*,_std::vector<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>_>
    ::operator++(&local_30);
  }
  __gnu_cxx::
  __normal_iterator<std::shared_ptr<trieste::NodeDef>const*,std::vector<std::shared_ptr<trieste::NodeDef>,std::allocator<std::shared_ptr<trieste::NodeDef>>>>
  ::__normal_iterator<std::shared_ptr<trieste::NodeDef>*>
            ((__normal_iterator<std::shared_ptr<trieste::NodeDef>const*,std::vector<std::shared_ptr<trieste::NodeDef>,std::allocator<std::shared_ptr<trieste::NodeDef>>>>
              *)&local_38,&last_local);
  __gnu_cxx::
  __normal_iterator<std::shared_ptr<trieste::NodeDef>const*,std::vector<std::shared_ptr<trieste::NodeDef>,std::allocator<std::shared_ptr<trieste::NodeDef>>>>
  ::__normal_iterator<std::shared_ptr<trieste::NodeDef>*>
            ((__normal_iterator<std::shared_ptr<trieste::NodeDef>const*,std::vector<std::shared_ptr<trieste::NodeDef>,std::allocator<std::shared_ptr<trieste::NodeDef>>>>
              *)&local_40,
             (__normal_iterator<std::shared_ptr<trieste::NodeDef>_*,_std::vector<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>_>
              *)&this_local);
  iVar4 = CLI::std::
          vector<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>
          ::erase((vector<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>
                   *)&this->children,local_38,local_40);
  return (NodeIt)iVar4._M_current;
}

Assistant:

NodeIt erase(NodeIt first, NodeIt last)
    {
      for (auto it = first; it != last; ++it)
      {
        // Only clear the parent if the node is not shared.
        if ((*it)->parent_ == this)
          (*it)->parent_ = nullptr;
      }

      return children.erase(first, last);
    }